

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_inet.cc
# Opt level: O0

size_t __thiscall
CSocekt::flyd_sock_ntop(CSocekt *this,sockaddr *sa,int port,u_char *text,size_t len)

{
  SourceFile file;
  SourceFile file_00;
  LogLevel LVar1;
  Logger *this_00;
  LogStream *this_01;
  LogStream *pLVar2;
  long in_RCX;
  int in_EDX;
  short *in_RSI;
  u_char *p;
  sockaddr_in *sin;
  uchar *in_stack_ffffffffffffdf68;
  unsigned_short v_00;
  int v;
  Logger *in_stack_ffffffffffffdf70;
  char (*in_stack_ffffffffffffdf78) [105];
  SourceFile *in_stack_ffffffffffffdf80;
  Logger *in_stack_ffffffffffffdfa0;
  Logger local_2010;
  Logger local_1018;
  short *local_40;
  short *local_38;
  long local_28;
  size_t local_8;
  
  if (*in_RSI == 2) {
    local_40 = in_RSI + 2;
    local_28 = in_RCX;
    if (in_EDX == 0) {
      LVar1 = muduo::Logger::logLevel();
      if ((int)LVar1 < 3) {
        muduo::Logger::SourceFile::SourceFile<105>
                  (in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf78);
        file_00._8_8_ = in_stack_ffffffffffffdf80;
        file_00.data_ = *in_stack_ffffffffffffdf78;
        muduo::Logger::Logger
                  (in_stack_ffffffffffffdf70,file_00,(int)((ulong)in_stack_ffffffffffffdf68 >> 0x20)
                  );
        muduo::Logger::stream(&local_2010);
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffdf70,in_stack_ffffffffffffdf68);
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffdf70,(unsigned_long)in_stack_ffffffffffffdf68);
        v = (int)((ulong)in_stack_ffffffffffffdf68 >> 0x20);
        muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffdf70,v);
        this_01 = muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffdf70,v);
        pLVar2 = muduo::LogStream::operator<<(this_01,v);
        muduo::LogStream::operator<<(this_01,(int)((ulong)pLVar2 >> 0x20));
        muduo::Logger::~Logger(in_stack_ffffffffffffdfa0);
      }
    }
    else {
      local_38 = in_RSI;
      LVar1 = muduo::Logger::logLevel();
      if ((int)LVar1 < 3) {
        muduo::Logger::SourceFile::SourceFile<105>
                  (in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf78);
        file._8_8_ = in_stack_ffffffffffffdf80;
        file.data_ = *in_stack_ffffffffffffdf78;
        muduo::Logger::Logger
                  (in_stack_ffffffffffffdf70,file,(int)((ulong)in_stack_ffffffffffffdf68 >> 0x20));
        muduo::Logger::stream(&local_1018);
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffdf70,in_stack_ffffffffffffdf68);
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffdf70,(unsigned_long)in_stack_ffffffffffffdf68);
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffdf70,
                   (int)((ulong)in_stack_ffffffffffffdf68 >> 0x20));
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffdf70,
                   (int)((ulong)in_stack_ffffffffffffdf68 >> 0x20));
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffdf70,
                   (int)((ulong)in_stack_ffffffffffffdf68 >> 0x20));
        this_00 = (Logger *)
                  muduo::LogStream::operator<<
                            ((LogStream *)in_stack_ffffffffffffdf70,
                             (int)((ulong)in_stack_ffffffffffffdf68 >> 0x20));
        v_00 = (unsigned_short)((ulong)in_stack_ffffffffffffdf68 >> 0x30);
        ntohs(local_38[1]);
        muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffdf70,v_00);
        muduo::Logger::~Logger(this_00);
      }
    }
    local_8 = (long)local_40 - local_28;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t CSocekt::flyd_sock_ntop(struct sockaddr *sa,int port,u_char *text,size_t len)
{
    struct sockaddr_in   *sin;
    u_char               *p;

    switch (sa->sa_family)
    {
        case AF_INET:
            sin = (struct sockaddr_in *) sa;
            p = (u_char *) &sin->sin_addr;
            if(port)  //端口信息也组合到字符串里
            {
                LOG_INFO << text << len << p[0] << p[1] << p[2] << p[3] << ntohs(sin->sin_port);
                //p = ngx_snprintf(text, len, "%ud.%ud.%ud.%ud:%d",p[0], p[1], p[2], p[3], ntohs(sin->sin_port)); //返回的是新的可写地址
            }
            else //不需要组合端口信息到字符串中
            {
                LOG_INFO << text << len << p[0] << p[1] << p[2] << p[3] ;
               // p = ngx_snprintf(text, len, "%ud.%ud.%ud.%ud",p[0], p[1], p[2], p[3]);
            }
            return (p - text);
            break;
        default:
            return 0;
            break;
    }
    return 0;
}